

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

Var Js::RegexHelper::RegexEs5SplitImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,CharCount limit,bool noResult,void *stackAllocationPointer)

{
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  charcount_t inputLength_00;
  uint32 uVar4;
  ScriptConfiguration *this;
  RecyclableObject *pRVar5;
  JavascriptLibrary *pJVar6;
  JavascriptArray *ary_00;
  RegexPattern *this_00;
  char16 *input_00;
  Var nonMatchValue_00;
  Var newValue;
  undefined4 *puVar7;
  GroupInfo local_b4;
  GroupInfo local_ac;
  int local_a4;
  CharCount local_a0;
  int groupId;
  CharCount endOffset;
  GroupInfo match_1;
  CharCount inputLimit;
  CharCount startOffset;
  CharCount copyOffset;
  GroupInfo match;
  RegexMatchState state;
  GroupInfo lastSuccessfulMatch;
  Var nonMatchValue;
  int numGroups;
  CharCount inputLength;
  char16 *inputStr;
  RegexPattern *splitPattern;
  JavascriptArray *ary;
  void *stackAllocationPointer_local;
  bool noResult_local;
  CharCount limit_local;
  JavascriptString *input_local;
  JavascriptRegExp *regularExpression_local;
  ScriptContext *scriptContext_local;
  
  if (noResult) {
    this = ScriptContext::GetConfig(scriptContext);
    bVar2 = ScriptConfiguration::SkipSplitOnNoResult(this);
    if (bVar2) {
      pJVar6 = ScriptContext::GetLibrary(scriptContext);
      pRVar5 = JavascriptLibraryBase::GetNull(&pJVar6->super_JavascriptLibraryBase);
      return pRVar5;
    }
  }
  RegexHelperTrace(scriptContext,Split,regularExpression,input);
  pJVar6 = ScriptContext::GetLibrary(scriptContext);
  ary_00 = JavascriptLibrary::CreateArrayOnStack(pJVar6,stackAllocationPointer);
  if (limit != 0) {
    this_00 = GetSplitPattern(scriptContext,regularExpression);
    input_00 = JavascriptString::GetString(input);
    inputLength_00 = JavascriptString::GetLength(input);
    uVar3 = UnifiedRegex::RegexPattern::NumGroups(this_00);
    nonMatchValue_00 = NonMatchValue(scriptContext,false);
    UnifiedRegex::GroupInfo::GroupInfo((GroupInfo *)&state.matcher);
    PrimBeginMatch((RegexMatchState *)&match,scriptContext,this_00,input_00,inputLength_00,false);
    if (inputLength_00 == 0) {
      _startOffset = PrimMatch((RegexMatchState *)&match,scriptContext,this_00,0,0);
      bVar2 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)&startOffset);
      if (bVar2) {
        Js::JavascriptArray::DirectAppendItem(ary_00,input);
      }
      else {
        state.matcher = (Matcher *)_startOffset;
      }
    }
    else {
      inputLimit = 0;
      match_1.length = 0;
      match_1.offset = inputLength_00;
LAB_01362ef5:
      if (match_1.length < match_1.offset) {
        _groupId = PrimMatch((RegexMatchState *)&match,scriptContext,this_00,inputLength_00,
                             match_1.length);
        bVar2 = UnifiedRegex::GroupInfo::IsUndefined((GroupInfo *)&groupId);
        if (bVar2) goto LAB_01363056;
        state.matcher = (Matcher *)_groupId;
        if (match_1.offset <= (uint)groupId) goto LAB_01363056;
        match_1.length = groupId;
        local_a0 = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)&groupId);
        if (local_a0 == inputLimit) {
          match_1.length = match_1.length + 1;
        }
        else {
          AppendSubString(scriptContext,ary_00,input,inputLimit,match_1.length);
          uVar4 = ArrayObject::GetLength(&ary_00->super_ArrayObject);
          if (limit <= uVar4) goto LAB_01363056;
          inputLimit = local_a0;
          match_1.length = local_a0;
          for (local_a4 = 1; local_a4 < (int)(uint)uVar3; local_a4 = local_a4 + 1) {
            newValue = GetGroup(scriptContext,this_00,input,nonMatchValue_00,local_a4);
            Js::JavascriptArray::DirectAppendItem(ary_00,newValue);
            uVar4 = ArrayObject::GetLength(&ary_00->super_ArrayObject);
            if (limit <= uVar4) break;
          }
        }
        goto LAB_01362ef5;
      }
LAB_01363056:
      uVar4 = ArrayObject::GetLength(&ary_00->super_ArrayObject);
      if (uVar4 < limit) {
        AppendSubString(scriptContext,ary_00,input,inputLimit,inputLength_00);
      }
    }
    PrimEndMatch((RegexMatchState *)&match,scriptContext,this_00);
    bVar2 = UnifiedRegex::RegexPattern::IsSticky(this_00);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                  ,0x719,"(!splitPattern->IsSticky())","!splitPattern->IsSticky()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar2 = UnifiedRegex::RegexPattern::IsGlobal(this_00);
    local_ac = (GroupInfo)state.matcher;
    UnifiedRegex::GroupInfo::GroupInfo(&local_b4);
    PropagateLastMatch(scriptContext,bVar2,false,regularExpression,input,local_ac,local_b4,true,true
                       ,true);
  }
  return ary_00;
}

Assistant:

Var RegexHelper::RegexEs5SplitImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, CharCount limit, bool noResult, void *const stackAllocationPointer)
    {
        if (noResult && scriptContext->GetConfig()->SkipSplitOnNoResult())
        {
            // TODO: Fix this so that the side effect for PropagateLastMatch is done
            return scriptContext->GetLibrary()->GetNull();
        }

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Split, regularExpression, input);
#endif

        JavascriptArray* ary = scriptContext->GetLibrary()->CreateArrayOnStack(stackAllocationPointer);

        if (limit == 0)
        {
            // SPECIAL CASE: Zero limit
            return ary;
        }

        UnifiedRegex::RegexPattern *splitPattern = GetSplitPattern(scriptContext, regularExpression);

        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength(); // s in spec
        const int numGroups = splitPattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, splitPattern, inputStr, inputLength, false);

        if (inputLength == 0)
        {
            // SPECIAL CASE: Empty string
            UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, 0);
            if (match.IsUndefined())
                ary->DirectAppendItem(input);
            else
                lastSuccessfulMatch = match;
        }
        else
        {
            CharCount copyOffset = 0;  // p in spec
            CharCount startOffset = 0; // q in spec

            CharCount inputLimit = inputLength;

            while (startOffset < inputLimit)
            {
                UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, startOffset);

                if (match.IsUndefined())
                    break;

                lastSuccessfulMatch = match;

                if (match.offset >= inputLimit)
                    break;

                startOffset = match.offset;
                CharCount endOffset = match.EndOffset(); // e in spec

                if (endOffset == copyOffset)
                    startOffset++;
                else
                {
                    AppendSubString(scriptContext, ary, input, copyOffset, startOffset);
                    if (ary->GetLength() >= limit)
                        break;

                    startOffset = copyOffset = endOffset;

                    for (int groupId = 1; groupId < numGroups; groupId++)
                    {
                        ary->DirectAppendItem(GetGroup(scriptContext, splitPattern, input, nonMatchValue, groupId));
                        if (ary->GetLength() >= limit)
                            break;
                    }
                }
            }

            if (ary->GetLength() < limit)
                AppendSubString(scriptContext, ary, input, copyOffset, inputLength);
        }

        PrimEndMatch(state, scriptContext, splitPattern);
        Assert(!splitPattern->IsSticky());
        PropagateLastMatch
            ( scriptContext
            , splitPattern->IsGlobal()
            , /* isSticky */ false
            , regularExpression
            , input
            , lastSuccessfulMatch
            , UnifiedRegex::GroupInfo()
            , /* updateRegex */ true
            , /* updateCtor */ true
            , /* useSplitPattern */ true );

        return ary;
    }